

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O2

void __thiscall OnDiskDataset::drop(OnDiskDataset *this)

{
  pointer pOVar1;
  pointer pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  pointer pOVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *idx_name;
  pointer fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  idx_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  pOVar1 = (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar3 = (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>.
                _M_impl.super__Vector_impl_data._M_start; pOVar3 != pOVar1; pOVar3 = pOVar3 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_48,&pOVar3->fname);
  }
  std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::clear(&this->indices);
  pbVar2 = local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (fname = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; fname != pbVar2; fname = fname + 1) {
    drop_file(this,fname);
  }
  drop_file(this,&(this->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload
                  .super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                  super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.files_fname);
  drop_file(this,&(this->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload
                  .super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                  super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.cache_fname);
  drop_file(this,&this->name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void OnDiskDataset::drop() {
    std::vector<std::string> idx_names;

    for (auto &indice : indices) {
        idx_names.push_back(indice.get_fname());
    }

    // deallocate objects to close FDs
    indices.clear();

    for (auto &idx_name : idx_names) {
        drop_file(idx_name);
    }

    drop_file(files_index->get_files_fname());
    drop_file(files_index->get_cache_fname());
    drop_file(get_name());
}